

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O3

ostream * Eigen::operator<<(ostream *s,DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *m)

{
  ostream *poVar1;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  IOFormat local_118;
  
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198," ","");
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"\n","");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
  IOFormat::IOFormat(&local_118,-1,0,&local_198,&local_1b8,&local_1d8,&local_158,&local_178,
                     &local_138);
  poVar1 = internal::print_matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                     (s,(Matrix<double,__1,__1,_0,__1,__1> *)m,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.coeffSeparator._M_dataplus._M_p != &local_118.coeffSeparator.field_2) {
    operator_delete(local_118.coeffSeparator._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.rowSpacer._M_dataplus._M_p != &local_118.rowSpacer.field_2) {
    operator_delete(local_118.rowSpacer._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.rowSeparator._M_dataplus._M_p != &local_118.rowSeparator.field_2) {
    operator_delete(local_118.rowSeparator._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.rowSuffix._M_dataplus._M_p != &local_118.rowSuffix.field_2) {
    operator_delete(local_118.rowSuffix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.rowPrefix._M_dataplus._M_p != &local_118.rowPrefix.field_2) {
    operator_delete(local_118.rowPrefix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.matSuffix._M_dataplus._M_p != &local_118.matSuffix.field_2) {
    operator_delete(local_118.matSuffix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.matPrefix._M_dataplus._M_p != &local_118.matPrefix.field_2) {
    operator_delete(local_118.matPrefix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  return poVar1;
}

Assistant:

std::ostream & operator <<
(std::ostream & s,
 const DenseBase<Derived> & m)
{
  return internal::print_matrix(s, m.eval(), EIGEN_DEFAULT_IO_FORMAT);
}